

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

bool absl::lts_20250127::str_format_internal::ConvertFloatImpl
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  undefined1 *puVar1;
  long lVar2;
  string_view data_postfix;
  Decomposed<long_double> decomposed_00;
  Decomposed<long_double> decomposed_01;
  uint3 uVar3;
  undefined3 uVar4;
  undefined8 uVar5;
  unkbyte10 Var6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  size_t sVar14;
  FormatConversionChar FVar15;
  uint uVar16;
  size_t sVar17;
  char *pcVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar22;
  ulong uVar23;
  byte e;
  ulong uVar24;
  int iVar25;
  FormatState *in_R8;
  uint uVar26;
  FormatSinkImpl *in_R9;
  long lVar27;
  FormatConversionSpecImpl *pFVar28;
  int iVar29;
  ulong uVar30;
  longdouble lVar31;
  longdouble in_ST1;
  uint128 uVar32;
  undefined1 auVar33 [16];
  uint128 lhs;
  string_view value;
  uint128 n;
  uint128 other;
  uint128 v_00;
  uint128 v_01;
  uint128 v_02;
  uint128 n_00;
  string_view data;
  uint128 v_03;
  uint128 v_04;
  string_view str;
  undefined2 uVar34;
  undefined6 uVar35;
  uint local_1d4;
  FormatConversionSpecImpl *local_1d0;
  uint128 local_1c8;
  longdouble local_1b4;
  ulong local_1a8;
  ulong local_1a0;
  FormatState local_198;
  char digits_buffer [20];
  long local_148;
  ushort uStack_140;
  Decomposed<long_double> decomposed;
  int local_10c;
  undefined1 local_108 [16];
  size_t local_f8;
  char *pcStack_f0;
  char buffer [171];
  ulong uVar13;
  ulong uVar21;
  
  local_108._0_10_ = v;
  Var6 = local_108._0_10_;
  local_108._8_2_ = (undefined2)((unkuint10)v >> 0x40);
  if ((short)local_108._8_2_ < 0) {
    lVar31 = -v;
    bVar9 = 0x2d;
LAB_003e760d:
    buffer[0] = bVar9;
    pcVar18 = buffer + 1;
    bVar9 = buffer[0];
  }
  else {
    lVar31 = v;
    bVar9 = 0x2b;
    if (((conv->flags_ & kShowPos) != kBasic) || (bVar9 = 0x20, (conv->flags_ & kSignCol) != kBasic)
       ) goto LAB_003e760d;
    pcVar18 = buffer;
    bVar9 = 0;
  }
  local_1b4 = v;
  local_108._0_10_ = Var6;
  if (NAN(lVar31)) {
    FVar15 = conv->conv_;
    pcVar20 = "NAN";
    pcVar11 = "nan";
LAB_003e7671:
    if ((FVar15 & ~x) == F) {
      pcVar11 = pcVar20;
    }
    if (FVar15 == X) {
      pcVar11 = pcVar20;
    }
    pcVar18[2] = pcVar11[2];
    *(undefined2 *)pcVar18 = *(undefined2 *)pcVar11;
    value._M_len = pcVar18 + (3 - (long)buffer);
    uVar26 = conv->flags_ & 1;
    in_R9 = (FormatSinkImpl *)(ulong)uVar26;
    in_R8 = (FormatState *)0xffffffffffffffff;
    value._M_str = buffer;
    bVar7 = FormatSinkImpl::PutPaddedString(sink,value,conv->width_,-1,SUB41(uVar26,0));
    if (bVar7) {
      return true;
    }
  }
  else {
    local_148 = SUB108(lVar31,0);
    uStack_140 = (ushort)((unkuint10)lVar31 >> 0x40);
    if ((~uStack_140 & 0x7fff) == 0 && local_148 == -0x8000000000000000) {
      FVar15 = conv->conv_;
      pcVar20 = "INF";
      pcVar11 = "inf";
      goto LAB_003e7671;
    }
  }
  sVar17 = 6;
  if (-1 < conv->precision_) {
    sVar17 = (size_t)(uint)conv->precision_;
  }
  local_1d4 = 0;
  frexpl(&local_10c);
  ldexpl(0x40);
  uVar26 = local_10c - 0x40;
  uint128::uint128(&decomposed.mantissa,in_ST1);
  FVar15 = conv->conv_;
  uVar16 = (FVar15 & 0xfffffffe) - 8;
  if (6 < uVar16) {
    return false;
  }
  pcVar18 = (char *)((long)&switchD_003e7748::switchdataD_0064bb14 +
                    (long)(int)(&switchD_003e7748::switchdataD_0064bb14)[uVar16]);
  uVar35 = (undefined6)(decomposed.mantissa.hi_ >> 0x10);
  local_1d0 = conv;
  local_198.sign_char = bVar9;
  local_198.precision = sVar17;
  local_198.conv = conv;
  local_198.sink = sink;
  decomposed.exponent = uVar26;
  switch(FVar15 & 0xfffffffe) {
  case 8:
    if (local_10c < 0x40) {
      if (uVar26 < 0xffffff80) {
        v_03.hi_._0_4_ = 0x40 - local_10c;
        v_03.lo_ = decomposed.mantissa.hi_;
        v_03.hi_._4_4_ = 0;
        anon_unknown_0::FormatFNegativeExpSlow
                  ((anon_unknown_0 *)decomposed.mantissa.lo_,v_03,(int)&local_198,in_R8);
        return true;
      }
      buffer[0x2a] = '.';
      if (uVar26 == 0xffffff80) {
        auVar33 = ZEXT816(0);
      }
      else {
        auVar33 = __lshrti3(decomposed.mantissa.lo_,decomposed.mantissa.hi_,0x40U - local_10c & 0xff
                           );
      }
      v_00.lo_ = auVar33._8_8_;
      v_00.hi_ = (uint64_t)(buffer + 0x2a);
      pcVar11 = anon_unknown_0::PrintIntegralDigitsFromRightFast(auVar33._0_8_,v_00,pcVar18);
      pcVar11[-1] = '0';
      v_01.hi_ = (uint64_t)(buffer + 0x2b);
      v_01.lo_ = decomposed.mantissa.hi_;
      pcVar18 = anon_unknown_0::PrintFractionalDigitsFast
                          ((anon_unknown_0 *)decomposed.mantissa.lo_,v_01,
                           (char *)(ulong)(0x40U - local_10c),(int)local_198.precision,(size_t)in_R9
                          );
      pcVar20 = pcVar11 + -1;
      if (pcVar11[-1] == '0') {
        pcVar20 = pcVar11;
      }
    }
    else {
      lVar27 = 0x3f;
      if (decomposed.mantissa.hi_ != 0) {
        for (; decomposed.mantissa.hi_ >> lVar27 == 0; lVar27 = lVar27 + -1) {
        }
      }
      if (decomposed.mantissa.lo_ == 0) {
        uVar16 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (decomposed.mantissa.lo_ != 0) {
          for (; decomposed.mantissa.lo_ >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar16 = (uint)lVar2 ^ 0x3f;
      }
      pcVar11 = (char *)(ulong)(uVar16 + 0x40);
      uVar10 = (uint)lVar27 ^ 0x3f;
      if (decomposed.mantissa.hi_ == 0) {
        uVar10 = uVar16 + 0x40;
      }
      iVar29 = (local_10c - uVar10) + 0x40;
      if (0x80 < iVar29) {
        v_04.hi_._0_4_ = uVar26;
        v_04.lo_ = decomposed.mantissa.hi_;
        v_04.hi_._4_4_ = 0;
        anon_unknown_0::FormatFPositiveExpSlow
                  ((anon_unknown_0 *)decomposed.mantissa.lo_,v_04,(int)&local_198,in_R8);
        return true;
      }
      buffer[0x2a] = '.';
      pcVar18 = buffer + 0x2b;
      if (iVar29 < 0x41) {
        pcVar20 = anon_unknown_0::PrintIntegralDigitsFromRightFast
                            (decomposed.mantissa.lo_ << ((byte)uVar26 & 0x3f),buffer + 0x2a);
      }
      else {
        auVar33 = __ashlti3(decomposed.mantissa.lo_,decomposed.mantissa.hi_,uVar26 & 0xff);
        v_02.hi_ = (uint64_t)(buffer + 0x2a);
        v_02.lo_ = auVar33._8_8_;
        pcVar20 = anon_unknown_0::PrintIntegralDigitsFromRightFast(auVar33._0_8_,v_02,pcVar11);
      }
    }
    pcVar11 = pcVar18 + -(long)pcVar20;
    if ((local_198.precision == 0) && (((local_198.conv)->flags_ & kAlt) == kBasic)) {
      pcVar11 = pcVar11 + -1;
    }
    digits_buffer[0] = '\0';
    digits_buffer[1] = '\0';
    digits_buffer[2] = '\0';
    digits_buffer[3] = '\0';
    digits_buffer[4] = '\0';
    digits_buffer[5] = '\0';
    digits_buffer[6] = '\0';
    digits_buffer[7] = '\0';
    pcVar18 = buffer + (local_198.precision - (long)pcVar18) + 0x2b;
    digits_buffer._8_8_ = (long)" \t" + 2;
    sVar14 = 0;
    uVar34 = 0x68cc;
    uVar35 = 0x41;
    sVar17 = 0;
    goto LAB_003e7de0;
  case 10:
    decomposed_01._20_4_ = decomposed._20_4_;
    decomposed_01.exponent = uVar26;
    decomposed_01.mantissa.hi_._0_2_ = (short)decomposed.mantissa.hi_;
    decomposed_01.mantissa.lo_ = decomposed.mantissa.lo_;
    decomposed_01.mantissa.hi_._2_6_ = uVar35;
    decomposed_01._24_8_ = decomposed._24_8_;
    bVar7 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                      (decomposed_01,sVar17,(Buffer *)buffer,(int *)&local_1d4);
    pFVar28 = local_1d0;
    if (!bVar7) {
LAB_003e78a9:
      bVar7 = anon_unknown_0::FallbackToSnprintf<long_double>(local_1b4,local_1d0,sink);
      return bVar7;
    }
    uVar26 = local_1d4;
    if (((local_1d0->flags_ & kAlt) == kBasic) &&
       (pcVar18 = anon_unknown_0::Buffer::back((Buffer *)buffer), uVar26 = local_1d4,
       *pcVar18 == '.')) {
      anon_unknown_0::Buffer::pop_back((Buffer *)buffer);
      uVar26 = local_1d4;
    }
    break;
  case 0xc:
    uVar23 = 1;
    if (sVar17 != 0) {
      uVar23 = sVar17;
    }
    decomposed_00._20_4_ = decomposed._20_4_;
    decomposed_00.exponent = uVar26;
    decomposed_00.mantissa.hi_._0_2_ = (short)decomposed.mantissa.hi_;
    decomposed_00.mantissa.lo_ = decomposed.mantissa.lo_;
    decomposed_00.mantissa.hi_._2_6_ = uVar35;
    decomposed_00._24_8_ = decomposed._24_8_;
    bVar7 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                      (decomposed_00,uVar23 - 1,(Buffer *)buffer,(int *)&local_1d4);
    pFVar28 = local_1d0;
    if (!bVar7) goto LAB_003e78a9;
    uVar30 = (ulong)(int)local_1d4;
    uVar26 = local_1d4;
    if ((long)uVar30 < 0) {
      if (0xfffffffb < local_1d4) {
        *(undefined1 *)(buffer._88_8_ + 1) = *(undefined1 *)buffer._88_8_;
        while( true ) {
          uVar26 = uVar26 + 1;
          puVar1 = (undefined1 *)(buffer._88_8_ + -1);
          if (uVar26 == 0) break;
          *(undefined1 *)buffer._88_8_ = 0x30;
          buffer._88_8_ = puVar1;
        }
        *(undefined1 *)buffer._88_8_ = 0x2e;
        *puVar1 = 0x30;
        uVar26 = 0;
        buffer._88_8_ = puVar1;
      }
    }
    else if (uVar30 < uVar23) {
      uVar26 = 0;
      if (local_1d4 != 0) {
        std::_V2::__rotate<char*>(buffer._88_8_ + 1,buffer._88_8_ + 2,buffer._88_8_ + uVar30 + 2);
        uVar26 = 0;
      }
    }
    if ((pFVar28->flags_ & kAlt) == kBasic) {
      while( true ) {
        pcVar18 = anon_unknown_0::Buffer::back((Buffer *)buffer);
        if (*pcVar18 != '0') break;
        anon_unknown_0::Buffer::pop_back((Buffer *)buffer);
      }
      pcVar18 = anon_unknown_0::Buffer::back((Buffer *)buffer);
      if (*pcVar18 == '.') {
        anon_unknown_0::Buffer::pop_back((Buffer *)buffer);
      }
    }
    if (uVar26 == 0) goto LAB_003e7e71;
    break;
  case 0xe:
    iVar29 = conv->precision_;
    iVar25 = -0x3ffe;
    if (local_10c + 0x40 < -0x3ffe) {
      iVar25 = local_10c + 0x40;
    }
    uVar26 = local_10c + 0x3c;
    local_1b4 = (longdouble)CONCAT64(local_1b4._4_6_,iVar29);
    for (; (decomposed.mantissa.lo_ != 0 || decomposed.mantissa.hi_ != 0 &&
           (-1 < (long)decomposed.mantissa.hi_));
        decomposed.mantissa.hi_ = decomposed.mantissa.hi_ << 1 | uVar23) {
      if ((int)(uVar26 + 4) < -0x3ffd) {
        lhs = (uint128)__lshrti3(decomposed.mantissa.lo_,decomposed.mantissa.hi_,
                                 '\x02' - (char)iVar25);
        uVar30 = 0xffffc002;
        uVar23 = 0;
        iVar29 = local_1b4._0_4_;
        goto LAB_003e795c;
      }
      uVar23 = decomposed.mantissa.lo_ >> 0x3f;
      decomposed.mantissa.lo_ = decomposed.mantissa.lo_ * 2;
      uVar26 = uVar26 - 1;
    }
    uVar23 = decomposed.mantissa.hi_ >> 0x3c;
    uVar30 = (ulong)uVar26;
    if (decomposed.mantissa.lo_ == 0 && decomposed.mantissa.hi_ == 0) {
      uVar30 = 0;
    }
    lhs.hi_ = decomposed.mantissa.hi_ << 4 | decomposed.mantissa.lo_ >> 0x3c;
    lhs.lo_ = decomposed.mantissa.lo_ << 4;
LAB_003e795c:
    uVar19 = 0;
    if (sVar17 < 0x21) {
      uVar19 = 0x20 - sVar17;
    }
    local_1c8 = lhs;
    if ((iVar29 < 0) || (0x1f < (uint)sVar17)) {
      if (-1 < iVar29) {
        uVar12 = 0;
        uVar24 = 0;
        goto LAB_003e7af5;
      }
    }
    else {
      uVar26 = (int)uVar19 * 4;
      cVar8 = -0x80 - (char)uVar26;
      uVar12 = __lshrti3(0xffffffffffffffff,0xffffffffffffffff,cVar8);
      local_1a8 = __lshrti3(0xffffffffffffffff,0,cVar8);
      uVar32.hi_ = local_1a8;
      uVar32.lo_ = uVar12;
      local_1a0 = uVar12;
      uVar32 = operator&(lhs,uVar32);
      uVar21 = uVar32.hi_;
      auVar33 = __ashlti3(8,0,uVar26 - 4 & 0xff);
      uVar22 = auVar33._8_8_;
      if (uVar32.lo_ == auVar33._0_8_ && (uVar21 ^ uVar22) == 0) {
        uVar13 = uVar23;
        if (uVar19 != 0x20) {
          n.hi_ = uVar19;
          n.lo_ = lhs.hi_;
          bVar9 = anon_unknown_0::GetNibble<absl::lts_20250127::uint128>
                            ((anon_unknown_0 *)lhs.lo_,n,uVar21 ^ uVar22);
          uVar13 = (ulong)bVar9;
        }
        uVar12 = local_1a8;
        uVar24 = local_1a0;
        if ((uVar13 & 1) != 0) {
LAB_003e7a98:
          auVar33 = __ashlti3(1,0,uVar26 & 0xff);
          if (0x1f < uVar19) {
            auVar33 = ZEXT816(0);
          }
          local_1c8 = (uint128)(auVar33 + (undefined1  [16])lhs);
          bVar9 = (char)uVar23 + (-1 < (long)local_1c8.hi_ && (long)lhs.hi_ < 0 || 0x1f < uVar19);
          uVar23 = (ulong)bVar9;
          uVar12 = local_1a8;
          uVar24 = local_1a0;
          if (0xf < bVar9) {
            local_1c8 = (uint128)ZEXT816(0);
            uVar30 = (ulong)((int)uVar30 + 4);
            uVar23 = 1;
          }
        }
      }
      else {
        uVar12 = local_1a8;
        uVar24 = local_1a0;
        if (uVar22 < uVar21 || uVar22 - uVar21 < (ulong)(auVar33._0_8_ < uVar32.lo_))
        goto LAB_003e7a98;
      }
LAB_003e7af5:
      other.lo_ = ~uVar24;
      other.hi_ = ~uVar12;
      uint128::operator&=(&local_1c8,other);
      iVar29 = local_1b4._0_4_;
      lhs = local_1c8;
    }
    uVar5 = digits_buffer._0_8_;
    local_1c8.hi_ = lhs.hi_;
    local_1c8.lo_ = lhs.lo_;
    lVar27 = (ulong)(FVar15 != A) * 0x10;
    pcVar18 = "0123456789ABCDEF0123456789abcdef" + lVar27;
    uVar3 = CONCAT12(pcVar18[uVar23],CONCAT11((FVar15 != A) << 5,0x30));
    digits_buffer._0_3_ = uVar3 | 0x5800;
    uVar4 = digits_buffer._0_3_;
    digits_buffer._0_8_ = CONCAT53(digits_buffer._3_5_,uVar3) | 0x5800;
    if ((((iVar29 < 0) || ((uint)sVar17 == 0)) &&
        ((-1 < iVar29 || (local_1c8.lo_ == 0 && local_1c8.hi_ == 0)))) &&
       ((local_1d0->flags_ & kAlt) == kBasic)) {
      pcVar11 = digits_buffer + 3;
    }
    else {
      pcVar11 = digits_buffer + 4;
      digits_buffer._4_4_ = SUB84(uVar5,4);
      digits_buffer[3] = '.';
      digits_buffer._0_4_ = CONCAT13(digits_buffer[3],uVar4);
    }
    uVar23 = 0;
    while( true ) {
      local_1c8.hi_ = lhs.hi_;
      local_1c8.lo_ = lhs.lo_;
      if ((anon_unknown_0 *)local_1c8.lo_ == (anon_unknown_0 *)0x0 && local_1c8.hi_ == 0) break;
      n_00.hi_ = 0x1f;
      n_00.lo_ = local_1c8.hi_;
      bVar9 = anon_unknown_0::GetNibble<absl::lts_20250127::uint128>
                        ((anon_unknown_0 *)local_1c8.lo_,n_00,(size_t)pcVar18);
      local_1c8 = lhs;
      pcVar11[uVar23] = "0123456789ABCDEF0123456789abcdef"[(ulong)bVar9 + lVar27];
      lhs = (uint128)((undefined1  [16])local_1c8 << 4);
      uVar23 = uVar23 + 1;
    }
    local_1c8 = lhs;
    if (local_1b4._0_4_ < 0) {
      pcVar18 = (char *)0x0;
    }
    else {
      pcVar18 = (char *)(sVar17 - uVar23);
      if (sVar17 < uVar23) {
        __assert_fail("state.precision >= digits_emitted",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3a5,
                      "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = absl::uint128]"
                     );
      }
    }
    pcVar20 = digits_buffer;
    pcVar11 = pcVar11 + (uVar23 - (long)pcVar20);
    buffer[0] = (FVar15 != A) << 5 | 0x50;
    buffer[1] = (char)(uVar30 >> 0x1f) * '\x02' + '+';
    iVar25 = (int)uVar30;
    iVar29 = -iVar25;
    if (0 < iVar25) {
      iVar29 = iVar25;
    }
    numbers_internal::FastIntToBuffer(iVar29,buffer + 2);
    sVar14 = strlen(buffer);
    uVar34 = SUB82(buffer,0);
    uVar35 = (undefined6)((ulong)buffer >> 0x10);
    sVar17 = 2;
    local_f8 = sVar14;
    pcStack_f0 = buffer;
LAB_003e7de0:
    data_postfix._M_str._0_2_ = uVar34;
    data_postfix._M_len = sVar14;
    data_postfix._M_str._2_6_ = uVar35;
    data._M_str = pcVar20;
    data._M_len = (size_t)pcVar11;
    anon_unknown_0::FinalPrint(&local_198,data,sVar17,(size_t)pcVar18,data_postfix);
    return true;
  }
  e = 0x45;
  if (pFVar28->conv_ != X) {
    e = ((pFVar28->conv_ & ~x) != F) << 5 | 0x45;
  }
  anon_unknown_0::PrintExponent(uVar26,e,(Buffer *)buffer);
LAB_003e7e71:
  str._M_str = (char *)pFVar28;
  str._M_len._0_1_ = buffer[0x58];
  str._M_len._1_1_ = buffer[0x59];
  str._M_len._2_1_ = buffer[0x5a];
  str._M_len._3_1_ = buffer[0x5b];
  str._M_len._4_1_ = buffer[0x5c];
  str._M_len._5_1_ = buffer[0x5d];
  str._M_len._6_1_ = buffer[0x5e];
  str._M_len._7_1_ = buffer[0x5f];
  anon_unknown_0::WriteBufferToSink
            ((anon_unknown_0 *)(ulong)bVar9,buffer[0x60] - (char)buffer._88_8_,str,
             (FormatConversionSpecImpl *)sink,in_R9);
  return true;
}

Assistant:

bool ConvertFloatImpl(long double v, const FormatConversionSpecImpl &conv,
                      FormatSinkImpl *sink) {
  if (IsDoubleDouble()) {
    // This is the `double-double` representation of `long double`. We do not
    // handle it natively. Fallback to snprintf.
    return FallbackToSnprintf(v, conv, sink);
  }

  return FloatToSink(v, conv, sink);
}